

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O1

int Proj(sunrealtype t,N_Vector ycur,N_Vector corr,sunrealtype epsProj,N_Vector err,void *user_data)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 (*pauVar4) [16];
  double *pdVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  
  pauVar4 = (undefined1 (*) [16])N_VGetArrayPointer(t,epsProj);
  pdVar5 = (double *)N_VGetArrayPointer(corr);
  dVar1 = *(double *)*pauVar4;
  dVar3 = *(double *)(*pauVar4 + 8);
  auVar7 = *pauVar4;
  dVar6 = dVar1 * dVar1 + dVar3 * dVar3;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  auVar2._8_8_ = dVar6;
  auVar2._0_8_ = dVar6;
  auVar7 = divpd(auVar7,auVar2);
  dVar6 = auVar7._0_8_;
  dVar8 = auVar7._8_8_;
  *pdVar5 = dVar6 - dVar1;
  pdVar5[1] = dVar8 - dVar3;
  if (err != (N_Vector)0x0) {
    pdVar5 = (double *)N_VGetArrayPointer(err);
    dVar1 = *pdVar5;
    *pdVar5 = dVar8 * dVar1 * dVar8 + -(pdVar5[1] * dVar6) * dVar8;
    pdVar5[1] = dVar8 * -dVar1 * dVar6 + pdVar5[1] * dVar6 * dVar6;
  }
  return 0;
}

Assistant:

static int Proj(sunrealtype t, N_Vector ycur, N_Vector corr,
                sunrealtype epsProj, N_Vector err, void* user_data)
{
  sunrealtype* ydata = N_VGetArrayPointer(ycur);
  sunrealtype* cdata = N_VGetArrayPointer(corr);
  sunrealtype* edata = NULL;
  sunrealtype x      = ydata[0];
  sunrealtype y      = ydata[1];
  sunrealtype xp, yp, r;
  sunrealtype errxp, erryp;

  /* project onto the unit circle */
  r = SQRT(x * x + y * y);

  xp = x / r;
  yp = y / r;

  /* correction to the unprojected solution */
  cdata[0] = xp - x;
  cdata[1] = yp - y;

  /* project the error */
  if (err != NULL)
  {
    edata = N_VGetArrayPointer(err);

    errxp = edata[0] * yp * yp - edata[1] * xp * yp;
    erryp = -edata[0] * xp * yp + edata[1] * xp * xp;

    edata[0] = errxp;
    edata[1] = erryp;
  }

  return (0);
}